

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

Mesh * Assimp::Ogre::OgreBinarySerializer::ImportMesh(MemoryStreamReader *stream)

{
  bool bVar1;
  DeadlyImportError *pDVar2;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar3;
  basic_formatter *this;
  Mesh *this_00;
  Mesh *mesh;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_a8;
  undefined1 local_88 [8];
  string version;
  allocator<char> local_51;
  string local_50;
  uint16_t local_2a;
  undefined1 local_28 [6];
  uint16_t id;
  OgreBinarySerializer serializer;
  MemoryStreamReader *stream_local;
  
  serializer._16_8_ = stream;
  OgreBinarySerializer((OgreBinarySerializer *)local_28,stream,AM_Mesh);
  local_2a = ReadHeader((OgreBinarySerializer *)local_28,false);
  if (local_2a != 0x1000) {
    version.field_2._M_local_buf[0xb] = '\x01';
    pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Invalid Ogre Mesh file header.",&local_51);
    DeadlyImportError::DeadlyImportError(pDVar2,&local_50);
    version.field_2._M_local_buf[0xb] = '\0';
    __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  ReadLine_abi_cxx11_((string *)local_88,(OgreBinarySerializer *)local_28);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)MESH_VERSION_1_8_abi_cxx11_);
  if (bVar1) {
    pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              (&local_220);
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_220,(char (*) [14])"Mesh version ");
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_88);
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar3,(char (*) [86])
                               " not supported by this importer. Run OgreMeshUpgrader tool on the file and try again."
                       );
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar3,(char (*) [22])" Supported versions: ");
    this = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             MESH_VERSION_1_8_abi_cxx11_);
    Formatter::basic_formatter::operator_cast_to_string(&local_a8,this);
    DeadlyImportError::DeadlyImportError(pDVar2,&local_a8);
    __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  this_00 = (Mesh *)operator_new(0x80);
  Ogre::Mesh::Mesh(this_00);
  while (bVar1 = AtEnd((OgreBinarySerializer *)local_28), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_2a = ReadHeader((OgreBinarySerializer *)local_28,true);
    if (local_2a == 0x3000) {
      ReadMesh((OgreBinarySerializer *)local_28,this_00);
    }
  }
  std::__cxx11::string::~string((string *)local_88);
  return this_00;
}

Assistant:

Mesh *OgreBinarySerializer::ImportMesh(MemoryStreamReader *stream)
{
    OgreBinarySerializer serializer(stream, OgreBinarySerializer::AM_Mesh);

    uint16_t id = serializer.ReadHeader(false);
    if (id != HEADER_CHUNK_ID) {
        throw DeadlyExportError("Invalid Ogre Mesh file header.");
    }

    /// @todo Check what we can actually support.
    std::string version = serializer.ReadLine();
    if (version != MESH_VERSION_1_8)
    {
        throw DeadlyExportError(Formatter::format() << "Mesh version " << version << " not supported by this importer. Run OgreMeshUpgrader tool on the file and try again."
            << " Supported versions: " << MESH_VERSION_1_8);
    }

    Mesh *mesh = new Mesh();
    while (!serializer.AtEnd())
    {
        id = serializer.ReadHeader();
        switch(id)
        {
            case M_MESH:
            {
                serializer.ReadMesh(mesh);
                break;
            }
        }
    }
    return mesh;
}